

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O2

void quicly_local_cid_init_set
               (quicly_local_cid_set_t *set,quicly_cid_encryptor_t *encryptor,
               quicly_cid_plaintext_t *new_cid)

{
  uint8_t *puVar1;
  uint64_t uVar2;
  uint __line;
  undefined4 uVar3;
  long lVar4;
  char *__assertion;
  
  memset(set,0,0xf0);
  set->_size = 1;
  set->_encryptor = encryptor;
  if (new_cid == (quicly_cid_plaintext_t *)0x0) {
    if (encryptor != (quicly_cid_encryptor_t *)0x0) {
      __assertion = 
      "new_cid != NULL && \"master CID must be specified when a non-zero length CID is to be used\""
      ;
      __line = 0x5c;
      goto LAB_00122230;
    }
  }
  else {
    if (new_cid->field_0x4 != '\0') {
      __assertion = "new_cid->path_id == 0";
      __line = 0x56;
LAB_00122230:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                    ,__line,
                    "void quicly_local_cid_init_set(quicly_local_cid_set_t *, quicly_cid_encryptor_t *, const quicly_cid_plaintext_t *)"
                   );
    }
    uVar3 = *(undefined4 *)&new_cid->field_0x4;
    uVar2 = new_cid->node_id;
    (set->plaintext).master_id = new_cid->master_id;
    *(undefined4 *)&(set->plaintext).field_0x4 = uVar3;
    (set->plaintext).node_id = uVar2;
    if (encryptor != (quicly_cid_encryptor_t *)0x0) {
      generate_cid(set,0);
    }
  }
  set->cids[0].state = QUICLY_LOCAL_CID_STATE_DELIVERED;
  for (lVar4 = 0x50; lVar4 != 0xf8; lVar4 = lVar4 + 0x38) {
    puVar1 = set->cids[0].cid.cid + lVar4 + -0x20;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
    puVar1[4] = 0xff;
    puVar1[5] = 0xff;
    puVar1[6] = 0xff;
    puVar1[7] = 0xff;
  }
  return;
}

Assistant:

void quicly_local_cid_init_set(quicly_local_cid_set_t *set, quicly_cid_encryptor_t *encryptor,
                               const quicly_cid_plaintext_t *new_cid)
{
    *set = (quicly_local_cid_set_t){
        ._encryptor = encryptor,
        ._size = 1,
    };

    /* if provided, set master id */
    if (new_cid != NULL) {
        assert(new_cid->path_id == 0);
        set->plaintext = *new_cid;
    }

    /* initialize cids[0] */
    if (encryptor != NULL) {
        assert(new_cid != NULL && "master CID must be specified when a non-zero length CID is to be used");
        generate_cid(set, 0);
    }
    set->cids[0].state =
        QUICLY_LOCAL_CID_STATE_DELIVERED; /* no need to use NCID frames, the use delivers this CID to the remote peer */

    for (size_t i = 1; i < PTLS_ELEMENTSOF(set->cids); i++)
        set->cids[i].sequence = UINT64_MAX;
}